

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sq.cpp
# Opt level: O0

void Interactive(HSQUIRRELVM v)

{
  undefined1 uVar1;
  int iVar2;
  SQChar *pSVar3;
  size_t sVar4;
  SQRESULT SVar5;
  HSQUIRRELVM in_RDI;
  SQInteger oldtop;
  int c;
  SQInteger i;
  HSQOBJECT bindingsTable;
  SQInteger done;
  SQInteger retval;
  SQInteger string;
  SQInteger blocks;
  SQChar buffer [1024];
  HSQUIRRELVM in_stack_fffffffffffffb98;
  HSQUIRRELVM in_stack_fffffffffffffba0;
  HSQUIRRELVM in_stack_fffffffffffffba8;
  HSQUIRRELVM in_stack_fffffffffffffbc0;
  long lVar6;
  SQChar *in_stack_fffffffffffffbc8;
  HSQUIRRELVM in_stack_fffffffffffffbd0;
  HSQUIRRELVM v_00;
  HSQUIRRELVM v_01;
  HSQUIRRELVM v_02;
  HSQOBJECT *bindings;
  char in_stack_fffffffffffffbf8;
  undefined7 in_stack_fffffffffffffbf9;
  SQChar *in_stack_fffffffffffffc00;
  HSQUIRRELVM in_stack_fffffffffffffc08;
  SQCollectable *in_stack_fffffffffffffc10;
  HSQUIRRELVM in_stack_fffffffffffffc18;
  
  bindings = (HSQOBJECT *)0x0;
  v_02 = (HSQUIRRELVM)0x0;
  v_01 = (HSQUIRRELVM)0x0;
  v_00 = (HSQUIRRELVM)0x0;
  PrintVersionInfos();
  sq_newtable(in_stack_fffffffffffffbc0);
  sq_getstackobj(in_stack_fffffffffffffba0,(SQInteger)in_stack_fffffffffffffb98,
                 (HSQOBJECT *)0x1166be);
  sq_addref(in_stack_fffffffffffffba0,(HSQOBJECT *)in_stack_fffffffffffffb98);
  sq_registerbaselib(in_stack_fffffffffffffba0);
  sq_pushstring(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
                (SQInteger)in_stack_fffffffffffffbc0);
  sq_pushuserpointer(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  sq_newclosure(v_01,(SQFUNCTION)v_00,(SQUnsignedInteger)in_stack_fffffffffffffbd0);
  sq_setparamscheck(in_stack_fffffffffffffc08,(SQInteger)in_stack_fffffffffffffc00,
                    (SQChar *)CONCAT71(in_stack_fffffffffffffbf9,in_stack_fffffffffffffbf8));
  sq_newslot(v_00,(SQInteger)in_stack_fffffffffffffbd0,(SQBool)in_stack_fffffffffffffbc8);
  sq_pop(in_stack_fffffffffffffba0,(SQInteger)in_stack_fffffffffffffb98);
  do {
    if (v_00 != (HSQUIRRELVM)0x0) {
      sq_release(in_stack_fffffffffffffb98,(HSQOBJECT *)0x116b0f);
      return;
    }
    lVar6 = 0;
    printf("\nsq>");
LAB_0011678e:
    if (v_00 != (HSQUIRRELVM)0x0) {
      return;
    }
    iVar2 = getchar();
    if (iVar2 == 10) {
      if ((lVar6 < 1) || ((&stack0xfffffffffffffbf7)[lVar6] != '\\')) {
        if (bindings == (HSQOBJECT *)0x0) goto LAB_001168ff;
      }
      else {
        (&stack0xfffffffffffffbf7)[lVar6] = 10;
      }
      (&stack0xfffffffffffffbf8)[lVar6] = 10;
LAB_001168fa:
      lVar6 = lVar6 + 1;
      goto LAB_0011678e;
    }
    uVar1 = (undefined1)iVar2;
    if (iVar2 == 0x7d) {
      bindings = (HSQOBJECT *)((long)&bindings[-1]._unVal + 7);
      (&stack0xfffffffffffffbf8)[lVar6] = uVar1;
      goto LAB_001168fa;
    }
    if ((iVar2 == 0x7b) && (v_02 == (HSQUIRRELVM)0x0)) {
      bindings = (HSQOBJECT *)((long)&bindings->_type + 1);
      (&stack0xfffffffffffffbf8)[lVar6] = uVar1;
      goto LAB_001168fa;
    }
    if ((iVar2 == 0x22) || (iVar2 == 0x27)) {
      v_02 = (HSQUIRRELVM)(ulong)((v_02 != (HSQUIRRELVM)0x0 ^ 0xffU) & 1);
      (&stack0xfffffffffffffbf8)[lVar6] = uVar1;
      goto LAB_001168fa;
    }
    if (lVar6 < 0x3ff) {
      (&stack0xfffffffffffffbf8)[lVar6] = uVar1;
      goto LAB_001168fa;
    }
    fprintf(_stderr,"sq : input line too long\n");
LAB_001168ff:
    (&stack0xfffffffffffffbf8)[lVar6] = 0;
    if (in_stack_fffffffffffffbf8 == '=') {
      pSVar3 = sq_getscratchpad(in_stack_fffffffffffffba0,(SQInteger)in_stack_fffffffffffffb98);
      snprintf(pSVar3,0x400,"return (%s)",&stack0xfffffffffffffbf9);
      in_stack_fffffffffffffba0 = (HSQUIRRELVM)&stack0xfffffffffffffbf8;
      in_stack_fffffffffffffba8 =
           (HSQUIRRELVM)
           sq_getscratchpad(in_stack_fffffffffffffba0,(SQInteger)in_stack_fffffffffffffb98);
      pSVar3 = sq_getscratchpad(in_stack_fffffffffffffba0,(SQInteger)in_stack_fffffffffffffb98);
      sVar4 = strlen(pSVar3);
      memcpy(in_stack_fffffffffffffba0,in_stack_fffffffffffffba8,sVar4 + 1);
      v_01 = (HSQUIRRELVM)0x1;
    }
    sVar4 = strlen(&stack0xfffffffffffffbf8);
    if (0 < (long)sVar4) {
      sq_gettop(in_RDI);
      SVar5 = sq_compile(in_stack_fffffffffffffc18,(SQChar *)in_stack_fffffffffffffc10,
                         (SQInteger)in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                         CONCAT71(in_stack_fffffffffffffbf9,in_stack_fffffffffffffbf8),bindings);
      if (-1 < SVar5) {
        sq_pushroottable((HSQUIRRELVM)0x116a17);
        SVar5 = sq_call(v_02,(SQInteger)v_01,(SQBool)v_00,(SQBool)in_stack_fffffffffffffbd0);
        if ((-1 < SVar5) && (v_01 != (HSQUIRRELVM)0x0)) {
          printf("\n");
          sq_pushroottable((HSQUIRRELVM)0x116a62);
          sq_pushstring(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,sVar4);
          sq_get(in_stack_fffffffffffffba8,(SQInteger)in_stack_fffffffffffffba0);
          sq_pushroottable((HSQUIRRELVM)0x116a9e);
          sq_push(in_stack_fffffffffffffba0,(SQInteger)in_stack_fffffffffffffb98);
          sq_call(v_02,(SQInteger)v_01,(SQBool)v_00,(SQBool)in_stack_fffffffffffffbd0);
          v_01 = (HSQUIRRELVM)0x0;
          printf("\n");
        }
      }
      sq_settop(in_stack_fffffffffffffba0,(SQInteger)in_stack_fffffffffffffb98);
    }
  } while( true );
}

Assistant:

void Interactive(HSQUIRRELVM v)
{

#define MAXINPUT 1024
    SQChar buffer[MAXINPUT];
    SQInteger blocks =0;
    SQInteger string=0;
    SQInteger retval=0;
    SQInteger done=0;
    PrintVersionInfos();

    HSQOBJECT bindingsTable;
    sq_newtable(v);
    sq_getstackobj(v, -1, &bindingsTable);
    sq_addref(v, &bindingsTable);

    sq_registerbaselib(v);

    sq_pushstring(v,_SC("quit"),-1);
    sq_pushuserpointer(v,&done);
    sq_newclosure(v,quit,1);
    sq_setparamscheck(v,1,NULL);
    sq_newslot(v,-3,SQFalse);

    sq_pop(v, 1); // bindingsTable

    while (!done)
    {
        SQInteger i = 0;
        printf(_SC("\nsq>"));
        for(;;) {
            int c;
            if(done)return;
            c = getchar();
            if (c == _SC('\n')) {
                if (i>0 && buffer[i-1] == _SC('\\'))
                {
                    buffer[i-1] = _SC('\n');
                }
                else if(blocks==0)break;
                buffer[i++] = _SC('\n');
            }
            else if (c==_SC('}')) {blocks--; buffer[i++] = (SQChar)c;}
            else if(c==_SC('{') && !string){
                    blocks++;
                    buffer[i++] = (SQChar)c;
            }
            else if(c==_SC('"') || c==_SC('\'')){
                    string=!string;
                    buffer[i++] = (SQChar)c;
            }
            else if (i >= MAXINPUT-1) {
                fprintf(stderr, _SC("sq : input line too long\n"));
                break;
            }
            else{
                buffer[i++] = (SQChar)c;
            }
        }
        buffer[i] = _SC('\0');

        if(buffer[0]==_SC('=')){
            scsprintf(sq_getscratchpad(v,MAXINPUT),(size_t)MAXINPUT,_SC("return (%s)"),&buffer[1]);
            memcpy(buffer,sq_getscratchpad(v,-1),(strlen(sq_getscratchpad(v,-1))+1)*sizeof(SQChar));
            retval=1;
        }
        i=strlen(buffer);
        if(i>0){
            SQInteger oldtop=sq_gettop(v);
            if(SQ_SUCCEEDED(sq_compile(v,buffer,i,_SC("interactive console"),SQTrue,&bindingsTable))){
                sq_pushroottable(v);
                if(SQ_SUCCEEDED(sq_call(v,1,retval,SQTrue)) &&  retval){
                    printf(_SC("\n"));
                    sq_pushroottable(v);
                    sq_pushstring(v,_SC("print"),-1);
                    sq_get(v,-2);
                    sq_pushroottable(v);
                    sq_push(v,-4);
                    sq_call(v,2,SQFalse,SQTrue);
                    retval=0;
                    printf(_SC("\n"));
                }
            }

            sq_settop(v,oldtop);
        }
    }

    sq_release(v, &bindingsTable);
}